

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O2

int32_t ceil_log2(int64_t x)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = 0;
  for (; 1 < x; x = (ulong)x >> 1) {
    if ((x & 1U) != 0) {
      iVar1 = 1;
    }
    iVar2 = iVar2 + 1;
  }
  return iVar1 + iVar2;
}

Assistant:

static int32_t
ceil_log2 (int64_t x)
{
    int32_t y = 0, r = 0;
    while (x > 1)
    {
        if (x & 1) r = 1;
        y += 1;
        x >>= 1;
    }
    return y + r;
}